

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O3

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenId(Lexer *this)

{
  size_t sVar1;
  undefined1 *__s2;
  size_t __n;
  int iVar2;
  int iVar3;
  Token *this_00;
  Token *pTVar4;
  TokenType type;
  undefined8 *puVar5;
  Lexer *in_RSI;
  vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  keywords;
  string id;
  Position local_88;
  undefined1 *local_68;
  size_t local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  Position local_48;
  
  local_68 = &local_58;
  local_60 = 0;
  local_58 = 0;
  std::__cxx11::string::reserve((ulong)&local_68);
  iVar3 = in_RSI->currentChar;
  if (iVar3 == 0x5f) {
    do {
      std::__cxx11::string::push_back((char)&local_68);
      nextChar(in_RSI);
      iVar3 = in_RSI->currentChar;
    } while (iVar3 == 0x5f);
  }
  if (iVar3 - 0x30U < 10) {
    getCurrentCursor(&local_88,in_RSI);
    sVar1 = in_RSI->currentEndIndex;
    local_48.line = (size_t)operator_new(0x38);
    ((Error<pfederc::LexerErrorCode> *)local_48.line)->logLevel = LVL_ERROR;
    ((Error<pfederc::LexerErrorCode> *)local_48.line)->err = LEX_ERR_ID_NO_DIGIT_AFTER_ANYS;
    (((Error<pfederc::LexerErrorCode> *)local_48.line)->pos).line = local_88.line;
    (((Error<pfederc::LexerErrorCode> *)local_48.line)->pos).startIndex = sVar1;
    (((Error<pfederc::LexerErrorCode> *)local_48.line)->pos).endIndex = sVar1;
LAB_00109860:
    (((Error<pfederc::LexerErrorCode> *)local_48.line)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((Error<pfederc::LexerErrorCode> *)local_48.line)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (((Error<pfederc::LexerErrorCode> *)local_48.line)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                        *)in_RSI);
    if ((Error<pfederc::LexerErrorCode> *)local_48.line != (Error<pfederc::LexerErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::LexerErrorCode>_> *)&local_48,
                 (Error<pfederc::LexerErrorCode> *)local_48.line);
    }
  }
  else {
    iVar2 = isalpha(iVar3);
    if (iVar2 == 0) {
      iVar3 = std::__cxx11::string::compare((char *)&local_68);
      if (iVar3 != 0) {
        getCurrentCursor(&local_88,in_RSI);
        local_48.line = (size_t)operator_new(0x38);
        ((Error<pfederc::LexerErrorCode> *)local_48.line)->logLevel = LVL_ERROR;
        ((Error<pfederc::LexerErrorCode> *)local_48.line)->err = LEX_ERR_ID_NOT_JUST_ANYS;
        (((Error<pfederc::LexerErrorCode> *)local_48.line)->pos).line = local_88.line;
        (((Error<pfederc::LexerErrorCode> *)local_48.line)->pos).startIndex = local_88.startIndex;
        (((Error<pfederc::LexerErrorCode> *)local_48.line)->pos).endIndex = local_88.endIndex;
        goto LAB_00109860;
      }
      getCurrentCursor(&local_88,in_RSI);
      this_00 = (Token *)operator_new(0x30);
      pTVar4 = in_RSI->currentToken;
      type = TOK_ANY;
    }
    else {
      while ((iVar3 == 0x5f || (iVar3 = isalnum(iVar3), iVar3 != 0))) {
        std::__cxx11::string::push_back((char)&local_68);
        nextChar(in_RSI);
        iVar3 = in_RSI->currentChar;
      }
      if (local_60 - 2 < 7) {
        std::
        vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_88,
                 (vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(KEYWORDS_abi_cxx11_ + (local_60 - 2) * 0x18));
        __n = local_60;
        __s2 = local_68;
        for (puVar5 = (undefined8 *)local_88.line; puVar5 != (undefined8 *)local_88.startIndex;
            puVar5 = puVar5 + 5) {
          if ((puVar5[1] == __n) &&
             ((__n == 0 || (iVar3 = bcmp((void *)*puVar5,__s2,__n), iVar3 == 0)))) {
            getCurrentCursor(&local_48,in_RSI);
            pTVar4 = (Token *)operator_new(0x30);
            Token::Token(pTVar4,in_RSI->currentToken,*(TokenType *)(puVar5 + 4),&local_48);
            this->_vptr_Lexer = (_func_int **)pTVar4;
            std::
            vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector((vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_88);
            goto LAB_00109a40;
          }
        }
        std::
        vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_88);
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_68);
      if (iVar3 == 0) {
        getCurrentCursor(&local_88,in_RSI);
        this_00 = (Token *)operator_new(0x30);
        pTVar4 = in_RSI->currentToken;
        type = TOK_OP_NULL;
      }
      else {
        getCurrentCursor(&local_88,in_RSI);
        this_00 = (Token *)operator_new(0x30);
        pTVar4 = in_RSI->currentToken;
        type = TOK_ID;
      }
    }
    Token::Token(this_00,pTVar4,type,&local_88);
    this->_vptr_Lexer = (_func_int **)this_00;
  }
LAB_00109a40:
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenId() noexcept {
  std::string id;
  id.reserve(16);
  // eat _ (important for checking if followed by alphabetic char)
  while (currentChar == '_') {
    id += currentChar;
    nextChar();
  }
  // must be followed by alpha character or just valid _ (TokenType::TOK_ANY)
  if (isdigit(currentChar)) {
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_ID_NO_DIGIT_AFTER_ANYS, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));
  } else if (!isalpha(currentChar)) {
    // check for any
    if (id == "_")
      return std::make_unique<Token>(currentToken, TokenType::TOK_ANY, getCurrentCursor());
    // __+ is not allowed
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_ID_NOT_JUST_ANYS, getCurrentCursor()));
  }

  while (currentChar == '_' || isalnum(currentChar)) {
    id += currentChar;
    nextChar();
  }

  // check if keword
  if (id.size() >= KEYWORDS_MIN_STRING_LENGTH
    && id.size() < KEYWORDS_MIN_STRING_LENGTH + KEYWORDS_LENGTH) {
    auto keywords = KEYWORDS[id.size() - KEYWORDS_MIN_STRING_LENGTH];
    for (const auto &tpl : keywords) {
      if (std::get<1>(tpl) == id)
        return std::make_unique<Token>(currentToken, std::get<0>(tpl), getCurrentCursor());
    }
  }
  // check if operator
  if (id == "null")
    return std::make_unique<Token>(currentToken, TokenType::TOK_OP_NULL, getCurrentCursor());

  return std::make_unique<Token>(currentToken, TokenType::TOK_ID, getCurrentCursor());
}